

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcPrint.c
# Opt level: O2

void Mvc_CubePrint(Mvc_Cover_t *pCover,Mvc_Cube_t *pCube)

{
  int iBit;
  uint uVar1;
  
  for (uVar1 = 0; (int)uVar1 < pCover->nBits; uVar1 = uVar1 + 1) {
    putchar(((pCube->pData[uVar1 >> 5] >> (uVar1 & 0x1f) & 1) != 0) + 0x30);
  }
  putchar(10);
  return;
}

Assistant:

void Mvc_CubePrint( Mvc_Cover_t * pCover, Mvc_Cube_t * pCube )
{
    int iBit, Value;
    // iterate through the literals
//    printf( "Size = %2d   ", Mvc_CubeReadSize(pCube) );
    Mvc_CubeForEachBit( pCover, pCube, iBit, Value )
        printf( "%c", '0' + Value );
    printf( "\n" );
}